

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O2

bool __thiscall cursespp::LayoutBase::SetFocus(LayoutBase *this,IWindowPtr *focus)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  pointer psVar5;
  long lVar6;
  LayoutBase *this_00;
  long lVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> a_Stack_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  peVar1 = (focus->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (LayoutBase *)(local_48 + 0x10);
    lVar7 = -2;
    this_01 = &local_30;
LAB_00187526:
    this->focused = (int)lVar7;
    EnsureValidFocus(this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
    bVar2 = true;
  }
  else {
    this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8);
    psVar5 = (this->focusable).
             super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->focusable).
                  super__Vector_base<std::shared_ptr<cursespp::IWindow>,_std::allocator<std::shared_ptr<cursespp::IWindow>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
    for (lVar7 = 0; lVar6 >> 4 != lVar7; lVar7 = lVar7 + 1) {
      if ((psVar5->super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          peVar1) {
        iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x25])(this);
        if (CONCAT44(extraout_var,iVar3) != 0) {
          plVar4 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar3),&IWindow::typeinfo,
                                          &ILayout::typeinfo,0xfffffffffffffffe);
          if (plVar4 != (long *)0x0) {
            std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<cursespp::IWindow,void>
                      (a_Stack_58,
                       (__weak_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2> *)
                       &(this->super_Window).super_enable_shared_from_this<cursespp::IWindow>);
            (**(code **)(*plVar4 + 0x60))(plVar4,a_Stack_58);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
          }
        }
        this_00 = (LayoutBase *)local_48;
        goto LAB_00187526;
      }
      psVar5 = psVar5 + 1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool LayoutBase::SetFocus(IWindowPtr focus) {
    if (!focus) {
        this->focused = NO_FOCUS;
        this->EnsureValidFocus();
        return true;
    }
    else {
        for (size_t i = 0; i < this->focusable.size(); i++) {
            if (this->focusable[i] == focus) {
                /* if we're focused, we need to ensure our parent sets its correct
                focus index to us! and so on up to the root view. note that this
                needs to be called before updating our internal focus; recursively,
                parents need to have their focus index set before children */
                auto asLayout = dynamic_cast<ILayout*>(this->GetParent());
                if (asLayout) {
                    asLayout->SetFocus(shared_from_this());
                }
                this->focused = i;
                this->EnsureValidFocus();
                return true;
            }
        }
    }
    return false;
}